

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_choose_race(command *cmd)

{
  player *p;
  undefined8 in_RAX;
  player_race *r;
  int *points_left_local;
  int *points_inc_local;
  int *inc;
  int *st;
  undefined1 in_R8B;
  wchar_t choice;
  guid local_14;
  
  local_14 = (guid)((ulong)in_RAX >> 0x20);
  cmd_get_arg_choice((command_conflict *)cmd,"choice",(int *)&local_14);
  p = player;
  r = player_id2race(local_14);
  points_left_local = (int *)0x0;
  player_generate(p,r,(player_class *)0x0,false);
  st = (int *)0x0;
  reset_stats((int *)0x0,(int *)r,points_inc_local,points_left_local,(_Bool)in_R8B);
  generate_stats(st,(int *)r,inc,points_left_local);
  rolled_stats = 0;
  return;
}

Assistant:

void do_cmd_choose_race(struct command *cmd)
{
	int choice;
	cmd_get_arg_choice(cmd, "choice", &choice);
	player_generate(player, player_id2race(choice), NULL, false);

	reset_stats(stats, points_spent, points_inc, &points_left, false);
	generate_stats(stats, points_spent, points_inc, &points_left);
	rolled_stats = false;
}